

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_optional.h
# Opt level: O2

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::character_t<char>,date::fraction_t<unsigned_int,9u>,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_> *fmt,
               cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others)

{
  bool bVar1;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> local_48;
  
  local_48.m_srcIt = pos->m_srcIt;
  local_48.m_srcEnd = pos->m_srcEnd;
  local_48.m_cache._0_4_ = *(undefined4 *)&pos->m_cache;
  local_48.m_cache._4_4_ = *(undefined4 *)((long)&pos->m_cache + 4);
  local_48.m_cacheSize._0_4_ = *(undefined4 *)&pos->m_cacheSize;
  local_48.m_cacheSize._4_4_ = *(undefined4 *)((long)&pos->m_cacheSize + 4);
  local_48.m_position = pos->m_position;
  bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,std::tuple<date::character_t<char>,date::fraction_t<unsigned_int,9u>>,0ul,1ul>
                    ();
  if (!bVar1) {
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator=
              (pos,&local_48);
  }
  bVar1 = cases_reader_t<2ul,2ul>::
          read<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>
                    (pos,end,others);
  return bVar1;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, optional_t<Formatters...>& fmt, Others&&... others)
{
    Iterator begin = pos;
    if (!read_impl(pos, end, fmt.formatters, std_impl::make_index_sequence<sizeof...(Formatters)>{}))
    {
        //! TODO: unset values of the optional formatters.
        pos = std::move(begin);
    }
    return read_impl(pos, end, std::forward<Others>(others)...);
}